

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_reload_Test::TestBody(ConfigTest_reload_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2a8 [8];
  Message local_2a0 [8];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_298;
  object local_278;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  string local_200;
  path local_1e0;
  path local_1b8;
  string local_190 [39];
  allocator<char> local_169;
  string local_168;
  path local_138;
  undefined1 local_110 [8];
  path file_path;
  config l_config;
  ConfigTest_reload_Test *this_local;
  
  jessilib::config::config((config *)&file_path._M_cmpts);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_138,(char (*) [12])"reload.test",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"some_data",&local_169);
  make_tmp_file((path *)local_110,&local_138,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::filesystem::__cxx11::path::~path(&local_138);
  std::__cxx11::string::string(local_190);
  jessilib::config::load((path *)&file_path._M_cmpts,(string *)local_110,(text_encoding)local_190);
  std::__cxx11::string::~string(local_190);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_1e0,(char (*) [12])"reload.test",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"some_other_data",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  make_tmp_file(&local_1b8,&local_1e0,&local_200);
  std::filesystem::__cxx11::path::~path(&local_1b8);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::filesystem::__cxx11::path::~path(&local_1e0);
  jessilib::config::reload();
  jessilib::config::data();
  std::__cxx11::u8string::u8string((u8string *)&local_298);
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_238,&local_278,&local_298);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_char8_t[16],_nullptr>
            ((EqHelper *)local_218,"l_config.data().get<std::u8string>()","u8\"some_other_data\"",
             &local_238,(char8_t (*) [16])"some_other_data");
  std::__cxx11::u8string::~u8string((u8string *)&local_238);
  std::__cxx11::u8string::~u8string((u8string *)&local_298);
  jessilib::object::~object(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_2a8);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::filesystem::__cxx11::path::~path((path *)local_110);
  jessilib::config::~config((config *)&file_path._M_cmpts);
  return;
}

Assistant:

TEST(ConfigTest, reload) {
	config l_config;

	// Write temp file out
	std::filesystem::path file_path = make_tmp_file("reload.test", "some_data");

	// Load data from disk
	l_config.load(file_path);

	// Write new data to disk
	make_tmp_file("reload.test", "some_other_data");

	// Reload data from disk and compare
	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_other_data");
}